

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O1

Address * __thiscall
cfd::AddressFactory::GetAddressByLockingScript
          (Address *__return_storage_ptr__,AddressFactory *this,Script *locking_script)

{
  ScriptType SVar1;
  bool bVar2;
  ScriptOperator *pSVar3;
  CfdException *this_00;
  Pubkey pubkey;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> items;
  string local_a0;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> local_80;
  ByteData local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ByteData local_38;
  
  core::Script::GetElementList(&local_80,locking_script);
  bVar2 = core::Script::IsP2pkScript(locking_script);
  if (bVar2) {
    core::ScriptElement::GetBinaryData
              (&local_38,
               local_80.
               super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
               ._M_impl.super__Vector_impl_data._M_start);
    core::Pubkey::Pubkey((Pubkey *)&local_a0,&local_38);
    if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    core::Address::Address
              (__return_storage_ptr__,this->type_,(Pubkey *)&local_a0,&this->prefix_list_);
  }
  else {
    bVar2 = core::Script::IsP2pkhScript(locking_script);
    if (bVar2) {
      core::ScriptElement::GetBinaryData
                (&local_68,
                 local_80.
                 super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                 ._M_impl.super__Vector_impl_data._M_start + 2);
      core::ByteData::GetBytes(&local_50,&local_68);
      core::ByteData160::ByteData160((ByteData160 *)&local_a0,&local_50);
      if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      core::Address::Address
                (__return_storage_ptr__,this->type_,kP2pkhAddress,(ByteData160 *)&local_a0,
                 &this->prefix_list_);
    }
    else {
      bVar2 = core::Script::IsP2shScript(locking_script);
      if (bVar2) {
        core::ScriptElement::GetBinaryData
                  (&local_68,
                   local_80.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        core::ByteData::GetBytes(&local_50,&local_68);
        core::ByteData160::ByteData160((ByteData160 *)&local_a0,&local_50);
        if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_68.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        core::Address::Address
                  (__return_storage_ptr__,this->type_,kP2shAddress,(ByteData160 *)&local_a0,
                   &this->prefix_list_);
      }
      else {
        bVar2 = core::Script::IsP2wpkhScript(locking_script);
        if (!bVar2) {
          bVar2 = core::Script::IsP2wshScript(locking_script);
          if (!bVar2) {
            bVar2 = core::Script::IsTaprootScript(locking_script);
            if (!bVar2) {
              bVar2 = core::Script::IsWitnessProgram(locking_script);
              if (bVar2) {
                pSVar3 = core::ScriptElement::GetOpCode
                                   (local_80.
                                    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                bVar2 = core::ScriptOperator::operator!=
                                  (pSVar3,(ScriptOperator *)core::ScriptOperator::OP_0);
                if (bVar2) {
                  pSVar3 = core::ScriptElement::GetOpCode
                                     (local_80.
                                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
                  SVar1 = pSVar3->data_type_;
                  core::ScriptElement::GetBinaryData
                            ((ByteData *)&local_a0,
                             local_80.
                             super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                             ._M_impl.super__Vector_impl_data._M_start + 1);
                  core::Address::Address
                            (__return_storage_ptr__,this->type_,
                             (SVar1 + kOpCheckMultiSigVerify & 0xff) + kVersion1,
                             (ByteData *)&local_a0,&this->prefix_list_);
                  goto LAB_003b5bde;
                }
              }
              bVar2 = core::Script::IsMultisigScript(locking_script);
              this_00 = (CfdException *)__cxa_allocate_exception(0x30);
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              if (bVar2) {
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_a0,"script type is multisig script.","");
                core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a0);
                __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException)
                ;
              }
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_a0,"unknown type locking script.","");
              core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a0);
              __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            core::ScriptElement::GetBinaryData
                      ((ByteData *)&local_a0,
                       local_80.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
            core::Address::Address
                      (__return_storage_ptr__,this->type_,kVersion1,(ByteData *)&local_a0,
                       &this->prefix_list_);
            goto LAB_003b5bde;
          }
        }
        core::ScriptElement::GetBinaryData
                  ((ByteData *)&local_a0,
                   local_80.
                   super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
        core::Address::Address
                  (__return_storage_ptr__,this->type_,this->wit_ver_,(ByteData *)&local_a0,
                   &this->prefix_list_);
      }
    }
  }
LAB_003b5bde:
  if (local_a0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            (&local_80);
  return __return_storage_ptr__;
}

Assistant:

Address AddressFactory::GetAddressByLockingScript(
    const Script& locking_script) const {
  std::vector<ScriptElement> items = locking_script.GetElementList();
  if (locking_script.IsP2pkScript()) {
    Pubkey pubkey = Pubkey(items[0].GetBinaryData());
    return CreateP2pkhAddress(pubkey);
  } else if (locking_script.IsP2pkhScript()) {
    ByteData160 hash = ByteData160(items[2].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2pkhAddress, hash);
  } else if (locking_script.IsP2shScript()) {
    ByteData160 hash = ByteData160(items[1].GetBinaryData().GetBytes());
    return GetAddressByHash(AddressType::kP2shAddress, hash);
  } else if (
      locking_script.IsP2wpkhScript() || locking_script.IsP2wshScript()) {
    return GetSegwitAddressByHash(items[1].GetBinaryData());
  } else if (locking_script.IsTaprootScript()) {
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), WitnessVersion::kVersion1);
  } else if (
      locking_script.IsWitnessProgram() &&
      (items[0].GetOpCode() != ScriptOperator::OP_0)) {
    uint8_t var = items[0].GetOpCode().GetDataType() - ScriptType::kOp_1;
    return GetSegwitAddressByHash(
        items[1].GetBinaryData(), static_cast<WitnessVersion>(var + 1));
  } else if (locking_script.IsMultisigScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "script type is multisig script.");
  } else {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "unknown type locking script.");
  }
}